

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

Locale * __thiscall
icu_63::Locale::forLanguageTag
          (Locale *__return_storage_ptr__,Locale *this,StringPiece tag,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  char *langtag;
  EVP_PKEY_CTX *ctx;
  UErrorCode *errorCode;
  int local_94;
  int32_t reslen;
  int32_t parsedLength;
  char *buffer;
  undefined1 local_80 [4];
  int32_t resultCapacity;
  CharString localeID;
  UErrorCode *status_local;
  StringPiece tag_local;
  Locale *result;
  
  errorCode = tag._8_8_;
  tag_local.ptr_._0_4_ = tag.ptr_._0_4_;
  status_local = (UErrorCode *)this;
  tag_local._8_8_ = __return_storage_ptr__;
  Locale(__return_storage_ptr__,eBOGUS);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    CharString::CharString((CharString *)local_80);
    buffer._4_4_ = StringPiece::size((StringPiece *)&status_local);
    while( true ) {
      _reslen = CharString::getAppendBuffer
                          ((CharString *)local_80,buffer._4_4_,buffer._4_4_,
                           (int32_t *)((long)&buffer + 4),errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') break;
      langtag = StringPiece::data((StringPiece *)&status_local);
      iVar2 = StringPiece::length((StringPiece *)&status_local);
      iVar2 = ulocimp_forLanguageTag_63(langtag,iVar2,_reslen,buffer._4_4_,&local_94,errorCode);
      if (*errorCode != U_BUFFER_OVERFLOW_ERROR) {
        UVar1 = ::U_FAILURE(*errorCode);
        if (UVar1 == '\0') {
          iVar3 = StringPiece::size((StringPiece *)&status_local);
          if (local_94 == iVar3) {
            CharString::append((CharString *)local_80,_reslen,iVar2,errorCode);
            if (*errorCode == U_STRING_NOT_TERMINATED_WARNING) {
              *errorCode = U_ZERO_ERROR;
            }
            UVar1 = ::U_FAILURE(*errorCode);
            if (UVar1 == '\0') {
              ctx = (EVP_PKEY_CTX *)CharString::data((CharString *)local_80);
              init(__return_storage_ptr__,ctx);
              UVar1 = isBogus(__return_storage_ptr__);
              if (UVar1 != '\0') {
                *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
              }
            }
          }
          else {
            *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          }
        }
        break;
      }
      *errorCode = U_ZERO_ERROR;
      buffer._4_4_ = iVar2;
    }
    localeID.len = 1;
    CharString::~CharString((CharString *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Locale U_EXPORT2
Locale::forLanguageTag(StringPiece tag, UErrorCode& status)
{
    Locale result(Locale::eBOGUS);

    if (U_FAILURE(status)) {
        return result;
    }

    // If a BCP-47 language tag is passed as the language parameter to the
    // normal Locale constructor, it will actually fall back to invoking
    // uloc_forLanguageTag() to parse it if it somehow is able to detect that
    // the string actually is BCP-47. This works well for things like strings
    // using BCP-47 extensions, but it does not at all work for things like
    // BCP-47 grandfathered tags (eg. "en-GB-oed") which are possible to also
    // interpret as ICU locale IDs and because of that won't trigger the BCP-47
    // parsing. Therefore the code here explicitly calls uloc_forLanguageTag()
    // and then Locale::init(), instead of just calling the normal constructor.

    // All simple language tags will have the exact same length as ICU locale
    // ID strings as they have as BCP-47 strings (like "en_US" for "en-US").
    CharString localeID;
    int32_t resultCapacity = tag.size();

    char* buffer;
    int32_t parsedLength, reslen;

    for (;;) {
        buffer = localeID.getAppendBuffer(
                /*minCapacity=*/resultCapacity,
                /*desiredCapacityHint=*/resultCapacity,
                resultCapacity,
                status);

        if (U_FAILURE(status)) {
            return result;
        }

        reslen = ulocimp_forLanguageTag(
                tag.data(),
                tag.length(),
                buffer,
                resultCapacity,
                &parsedLength,
                &status);

        if (status != U_BUFFER_OVERFLOW_ERROR) {
            break;
        }

        // For all BCP-47 language tags that use extensions, the corresponding
        // ICU locale ID will be longer but uloc_forLanguageTag() does compute
        // the exact length needed so this memory reallocation will be done at
        // most once.
        resultCapacity = reslen;
        status = U_ZERO_ERROR;
    }

    if (U_FAILURE(status)) {
        return result;
    }

    if (parsedLength != tag.size()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    localeID.append(buffer, reslen, status);
    if (status == U_STRING_NOT_TERMINATED_WARNING) {
        status = U_ZERO_ERROR;  // Terminators provided by CharString.
    }

    if (U_FAILURE(status)) {
        return result;
    }

    result.init(localeID.data(), /*canonicalize=*/FALSE);
    if (result.isBogus()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return result;
}